

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

void __thiscall FLinePortalTraverse::AddLineIntercepts(FLinePortalTraverse *this,int bx,int by)

{
  divline_t *line;
  double dVar1;
  double dVar2;
  anon_union_8_2_50eab53d_for_d aVar3;
  double dVar4;
  double dVar5;
  FPortalBlock *pFVar6;
  FPortalBlock *pFVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint i;
  ulong uVar11;
  intercept_t newintercept;
  undefined1 local_78 [16];
  anon_union_8_2_50eab53d_for_d local_68;
  divline_t local_58;
  
  pFVar7 = PortalBlockmap.data.Array;
  if ((((-1 < by) && (-1 < bx)) && (by < bmapheight)) && (bx < bmapwidth)) {
    iVar10 = by * PortalBlockmap.dx + bx;
    pFVar6 = PortalBlockmap.data.Array + iVar10;
    line = &(this->super_FPathTraverse).trace;
    for (uVar11 = 0; uVar11 < pFVar7[iVar10].portallines.Count; uVar11 = uVar11 + 1) {
      aVar3 = (anon_union_8_2_50eab53d_for_d)
              ((anon_union_8_2_50eab53d_for_d *)((pFVar6->portallines).Array + uVar11))->line;
      if ((aVar3.line)->validcount != validcount) {
        local_58.x = ((aVar3.line)->v1->p).X;
        local_58.y = ((aVar3.line)->v1->p).Y;
        iVar8 = P_PointOnDivlineSide((DVector2 *)&local_58,line);
        local_78._0_8_ = ((aVar3.line)->v2->p).X;
        local_78._8_8_ = ((aVar3.line)->v2->p).Y;
        iVar9 = P_PointOnDivlineSide((DVector2 *)local_78,line);
        if (iVar8 != iVar9) {
          local_58.x = ((aVar3.line)->v1->p).X;
          local_58.y = ((aVar3.line)->v1->p).Y;
          dVar4 = ((aVar3.line)->delta).X;
          dVar5 = ((aVar3.line)->delta).Y;
          dVar1 = (this->super_FPathTraverse).trace.x;
          dVar2 = (this->super_FPathTraverse).trace.y;
          if (((local_58.x - dVar1) * dVar5 + (dVar2 - local_58.y) * dVar4 <= 1.52587890625e-05) &&
             (1.52587890625e-05 <
              (local_58.x - (dVar1 + (this->super_FPathTraverse).trace.dx)) * dVar5 +
              ((dVar2 + (this->super_FPathTraverse).trace.dy) - local_58.y) * dVar4)) {
            local_58.dx = dVar4;
            local_58.dy = dVar5;
            dVar1 = P_InterceptVector(line,&local_58);
            if ((0.0 <= dVar1) && (dVar1 <= 1.0)) {
              local_78._8_2_ = 1;
              local_78._0_8_ = dVar1;
              local_68 = aVar3;
              TArray<intercept_t,_intercept_t>::Push
                        (&FPathTraverse::intercepts,(intercept_t *)local_78);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FLinePortalTraverse::AddLineIntercepts(int bx, int by)
{
	if (by < 0 || by >= bmapheight || bx < 0 || bx >= bmapwidth) return;

	FPortalBlock &block = PortalBlockmap(bx, by);

	for (unsigned i = 0; i<block.portallines.Size(); i++)
	{
		line_t *ld = block.portallines[i];
		double frac;
		divline_t dl;

		if (ld->validcount == validcount) continue;	// already processed

		if (P_PointOnDivlineSide (ld->v1->fPos(), &trace) ==
			P_PointOnDivlineSide (ld->v2->fPos(), &trace))
		{
			continue;		// line isn't crossed
		}
		P_MakeDivline (ld, &dl);
		if (P_PointOnDivlineSide(trace.x, trace.y, &dl) != 0 ||
			P_PointOnDivlineSide(trace.x + trace.dx, trace.y + trace.dy, &dl) != 1)
		{
			continue;		// line isn't crossed from the front side
		}

		// hit the line
		P_MakeDivline(ld, &dl);
		frac = P_InterceptVector(&trace, &dl);
		if (frac < 0 || frac > 1.) continue;	// behind source

		intercept_t newintercept;

		newintercept.frac = frac;
		newintercept.isaline = true;
		newintercept.done = false;
		newintercept.d.line = ld;
		intercepts.Push(newintercept);
	}
}